

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_strategy.h
# Opt level: O0

int32_t __thiscall charls::decoder_strategy::read_high_bits(decoder_strategy *this)

{
  bool bVar1;
  undefined4 local_20;
  int32_t high_bits_count;
  int32_t count;
  decoder_strategy *this_local;
  
  this_local._4_4_ = peek_0_bits(this);
  if (this_local._4_4_ < 0) {
    skip(this,0xf);
    local_20 = 0xf;
    while( true ) {
      bVar1 = read_bit(this);
      if (bVar1) break;
      local_20 = local_20 + 1;
    }
    this_local._4_4_ = local_20;
  }
  else {
    skip(this,this_local._4_4_ + 1);
  }
  return this_local._4_4_;
}

Assistant:

FORCE_INLINE int32_t read_high_bits()
    {
        const int32_t count{peek_0_bits()};
        if (count >= 0)
        {
            skip(count + 1);
            return count;
        }
        skip(15);

        for (int32_t high_bits_count{15};; ++high_bits_count)
        {
            if (read_bit())
                return high_bits_count;
        }
    }